

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_paramSwitch_e
ZSTD_resolveRowMatchFinderMode(ZSTD_paramSwitch_e mode,ZSTD_compressionParameters *cParams)

{
  if (mode != ZSTD_ps_auto) {
    return mode;
  }
  if (cParams->strategy - ZSTD_btlazy2 < 0xfffffffd) {
    return ZSTD_ps_disable;
  }
  return (cParams->windowLog < 0xf) + ZSTD_ps_enable;
}

Assistant:

static ZSTD_paramSwitch_e ZSTD_resolveRowMatchFinderMode(ZSTD_paramSwitch_e mode,
                                                         const ZSTD_compressionParameters* const cParams) {
#if defined(ZSTD_ARCH_X86_SSE2) || defined(ZSTD_ARCH_ARM_NEON)
    int const kHasSIMD128 = 1;
#else
    int const kHasSIMD128 = 0;
#endif
    if (mode != ZSTD_ps_auto) return mode; /* if requested enabled, but no SIMD, we still will use row matchfinder */
    mode = ZSTD_ps_disable;
    if (!ZSTD_rowMatchFinderSupported(cParams->strategy)) return mode;
    if (kHasSIMD128) {
        if (cParams->windowLog > 14) mode = ZSTD_ps_enable;
    } else {
        if (cParams->windowLog > 17) mode = ZSTD_ps_enable;
    }
    return mode;
}